

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdEncodeSignatureByDer
              (void *handle,char *signature,int sighash_type,bool sighash_anyone_can_pay,
              char **der_signature)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  byte in_CL;
  uint8_t in_DL;
  char *in_RSI;
  undefined8 *in_R8;
  CfdException *except;
  exception *std_except;
  ByteData der_sig;
  SigHashType type;
  string *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffea0;
  allocator *paVar4;
  string *in_stack_fffffffffffffee0;
  allocator local_f9;
  string local_f8 [32];
  ByteData local_d8;
  SigHashType local_c0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  undefined8 *local_28;
  byte local_1d;
  uint8_t local_1c;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_1d = in_CL & 1;
  local_28 = in_R8;
  local_18 = in_RSI;
  local_1c = in_DL;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x389;
    local_50.funcname = "CfdEncodeSignatureByDer";
    cfd::core::logger::warn<>(&local_50,"signature is null or empty.");
    local_72 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_70,"Failed to parameter. signature is null or empty.",&local_71);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffea0,error_code,in_stack_fffffffffffffe90);
    local_72 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_18 == (char *)0x0) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x38f;
    local_90.funcname = "CfdEncodeSignatureByDer";
    cfd::core::logger::warn<>(&local_90,"der_signature is null.");
    local_b2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Failed to parameter. der_signature is null.",&local_b1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffea0,error_code,in_stack_fffffffffffffe90);
    local_b2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::SigHashType::Create(&local_c0,local_1c,(bool)(local_1d & 1),false);
  paVar4 = &local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,local_18,paVar4);
  cfd::core::CryptoUtil::ConvertSignatureToDer(&local_d8,(string *)local_f8,&local_c0);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&stack0xfffffffffffffee0,&local_d8);
  pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffee0);
  *local_28 = pcVar3;
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
  local_4 = 0;
  cfd::core::ByteData::~ByteData((ByteData *)0x5d41f6);
  return local_4;
}

Assistant:

int CfdEncodeSignatureByDer(
    void* handle, const char* signature, int sighash_type,
    bool sighash_anyone_can_pay, char** der_signature) {
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (signature == nullptr) {
      warn(CFD_LOG_SOURCE, "der_signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. der_signature is null.");
    }

    SigHashType type = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    ByteData der_sig = CryptoUtil::ConvertSignatureToDer(signature, type);
    *der_signature = CreateString(der_sig.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}